

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

char * cmsys::SystemTools::RemoveChars(char *str,char *toremove)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  char *pcVar5;
  char cVar6;
  
  if (str == (char *)0x0) {
    return (char *)0x0;
  }
  sVar1 = strlen(str);
  pcVar2 = (char *)operator_new__(sVar1 + 1);
  cVar4 = *str;
  pcVar3 = pcVar2;
  if (cVar4 != '\0') {
    do {
      cVar6 = *toremove;
      pcVar5 = toremove + 1;
      while (cVar6 != '\0') {
        if (cVar4 == cVar6) goto LAB_00106c3d;
        cVar6 = *pcVar5;
        pcVar5 = pcVar5 + 1;
      }
      *pcVar3 = cVar4;
      pcVar3 = pcVar3 + 1;
LAB_00106c3d:
      cVar4 = str[1];
      str = str + 1;
    } while (cVar4 != '\0');
  }
  *pcVar3 = '\0';
  return pcVar2;
}

Assistant:

char* SystemTools::RemoveChars(const char* str, const char* toremove)
{
  if (!str) {
    return KWSYS_NULLPTR;
  }
  char* clean_str = new char[strlen(str) + 1];
  char* ptr = clean_str;
  while (*str) {
    const char* str2 = toremove;
    while (*str2 && *str != *str2) {
      ++str2;
    }
    if (!*str2) {
      *ptr++ = *str;
    }
    ++str;
  }
  *ptr = '\0';
  return clean_str;
}